

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::merge(JSONNode *this,uint num,...)

{
  internalJSONNode *piVar1;
  char in_AL;
  undefined8 *puVar2;
  undefined8 in_RCX;
  ulong uVar3;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  allocator local_e9;
  json_string local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  piVar1 = this->internal;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  std::__cxx11::string::string((string *)&local_e8,"no internal",&local_e9);
  JSONDebug::_JSON_ASSERT(piVar1 != (internalJSONNode *)0x0,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  local_e8.field_2._M_allocated_capacity = (size_type)local_c8;
  local_e8._M_string_length = (size_type)&stack0x00000008;
  local_e8._M_dataplus._M_p = (pointer)0x3000000010;
  while (bVar4 = num != 0, num = num - 1, bVar4) {
    uVar3 = (ulong)local_e8._M_dataplus._M_p & 0xffffffff;
    if (uVar3 < 0x29) {
      local_e8._M_dataplus._M_p._0_4_ = (int)local_e8._M_dataplus._M_p + 8;
      puVar2 = (undefined8 *)(uVar3 + local_e8.field_2._M_allocated_capacity);
    }
    else {
      puVar2 = (undefined8 *)local_e8._M_string_length;
      local_e8._M_string_length = (size_type)(local_e8._M_string_length + 8);
    }
    merge(this,(JSONNode *)*puVar2);
  }
  return;
}

Assistant:

void JSONNode::merge(unsigned int, ...) json_nothrow {
#endif
    JSON_CHECK_INTERNAL();
    #ifdef JSON_REF_COUNT
	   va_list args;
	   va_start(args, num);
	   for(unsigned int i = 0; i < num; ++i){
		  merge(va_arg(args, JSONNode*));
	   }
	   va_end(args);
    #endif
}